

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::_get_permute_axes<unsigned_int>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,char *permut,
          uint *param_2)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  CImgArgumentException *this_00;
  uint *puVar9;
  long lVar10;
  int iVar11;
  uint *puVar12;
  long lVar13;
  int y_1;
  long lVar14;
  int y;
  long lVar15;
  long lVar16;
  char *pcVar17;
  uint *puVar18;
  CImg<unsigned_int> res;
  ulong uVar8;
  
  bVar3 = is_empty(this);
  if (permut == (char *)0x0 || bVar3) {
    CImg(__return_storage_ptr__,this,false);
    return __return_storage_ptr__;
  }
  res._data = (uint *)0x0;
  res._width = 0;
  res._height = 0;
  res._depth = 0;
  res._spectrum = 0;
  res._is_shared = false;
  puVar18 = this->_data;
  iVar4 = cimg::strncasecmp(permut,"xyzc",4);
  if (iVar4 == 0) {
    operator+(__return_storage_ptr__,this);
  }
  else {
    iVar4 = cimg::strncasecmp(permut,"xycz",4);
    if (iVar4 == 0) {
      assign(&res,this->_width,this->_height,this->_spectrum,this->_depth);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar4 = 0; iVar4 < (int)this->_height; iVar4 = iVar4 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar4 + iVar11)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"xzyc",4);
    if (iVar4 == 0) {
      assign(&res,this->_width,this->_depth,this->_height,this->_spectrum);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar14 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar13 +
                        (ulong)(res._width * iVar4 + iVar11)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"xzcy",4);
    if (iVar4 == 0) {
      assign(&res,this->_width,this->_depth,this->_spectrum,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar4 + iVar11)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"xcyz",4);
    if (iVar4 == 0) {
      assign(&res,this->_width,this->_spectrum,this->_height,this->_depth);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar14 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar13 +
                        (ulong)(res._width * iVar4 + iVar11)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"xczy",4);
    if (iVar4 == 0) {
      assign(&res,this->_width,this->_spectrum,this->_depth,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar4 + iVar11)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"yxzc",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_width,this->_depth,this->_spectrum);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar4 = 0; iVar4 < (int)this->_height; iVar4 = iVar4 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar14 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar13 +
                        (ulong)(res._width * iVar11 + iVar4)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"yxcz",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_width,this->_spectrum,this->_depth);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar4 = 0; iVar4 < (int)this->_height; iVar4 = iVar4 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar11 + iVar4)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"yzxc",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_depth,this->_width,this->_spectrum);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar13 = 0;
      for (lVar14 = 0; lVar14 < (int)this->_spectrum; lVar14 = lVar14 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
          }
        }
        lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
      }
    }
    iVar4 = cimg::strncasecmp(permut,"yzcx",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_depth,this->_spectrum,this->_width);
      uVar7 = this->_width;
      switch(uVar7) {
      case 1:
        uVar7 = this->_depth;
        uVar5 = this->_height;
        uVar6 = this->_spectrum;
        for (lVar10 = 0; uVar7 * uVar5 * uVar6 != (int)lVar10; lVar10 = lVar10 + 1) {
          uVar2 = *puVar18;
          puVar18 = puVar18 + 1;
          res._data[lVar10] = uVar2;
        }
        break;
      case 2:
        iVar4 = this->_depth * this->_height * this->_spectrum;
        puVar9 = res._data;
        while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
          *puVar9 = *puVar18;
          puVar9[res._height * res._width * res._depth] = puVar18[1];
          puVar9 = puVar9 + 1;
          puVar18 = puVar18 + 2;
        }
        break;
      case 3:
        uVar7 = res._height * res._width * res._depth;
        iVar4 = this->_depth * this->_height * this->_spectrum;
        puVar9 = res._data;
        while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
          *puVar9 = *puVar18;
          puVar9[uVar7] = puVar18[1];
          puVar9[uVar7 * 2] = puVar18[2];
          puVar9 = puVar9 + 1;
          puVar18 = puVar18 + 3;
        }
        break;
      case 4:
        uVar7 = res._height * res._width * res._depth;
        iVar4 = this->_depth * this->_height * this->_spectrum;
        puVar9 = res._data;
        while (bVar3 = iVar4 != 0, iVar4 = iVar4 + -1, bVar3) {
          *puVar9 = *puVar18;
          puVar9[uVar7] = puVar18[1];
          puVar9[uVar7 * 2] = puVar18[2];
          puVar9[uVar7 * 3] = puVar18[3];
          puVar9 = puVar9 + 1;
          puVar18 = puVar18 + 4;
        }
        break;
      default:
        lVar10 = (ulong)res._height * (res._0_8_ & 0xffffffff);
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)this->_spectrum; lVar14 = lVar14 + 1) {
          for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
              lVar15 = (long)res._data + lVar13;
              for (lVar16 = 0; lVar16 < (int)uVar7; lVar16 = lVar16 + 1) {
                uVar7 = *puVar18;
                puVar18 = puVar18 + 1;
                *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
                uVar7 = this->_width;
                lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
              }
            }
          }
          lVar13 = lVar13 + lVar10 * 4;
        }
        CImg(__return_storage_ptr__,&res);
        goto LAB_00132281;
      }
    }
    iVar4 = cimg::strncasecmp(permut,"ycxz",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_spectrum,this->_width,this->_depth);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
          }
          lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"yczx",4);
    if (iVar4 == 0) {
      assign(&res,this->_height,this->_spectrum,this->_depth,this->_width);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
              lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
            }
          }
          lVar13 = lVar13 + lVar10 * 4;
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zxyc",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_width,this->_height,this->_spectrum);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar14 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar13 +
                        (ulong)(res._width * iVar11 + iVar4)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zxcy",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_width,this->_spectrum,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (lVar13 = 0; lVar13 < (int)this->_spectrum; lVar13 = lVar13 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar11 + iVar4)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zyxc",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_height,this->_width,this->_spectrum);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar13 = 0;
      for (lVar14 = 0; lVar14 < (int)this->_spectrum; lVar14 = lVar14 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
          }
        }
        lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zycx",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_height,this->_spectrum,this->_width);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      lVar13 = 0;
      for (lVar14 = 0; lVar14 < (int)this->_spectrum; lVar14 = lVar14 + 1) {
        for (iVar4 = 0; iVar4 < (int)this->_depth; iVar4 = iVar4 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
            }
          }
        }
        lVar13 = lVar13 + lVar10 * 4;
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zcxy",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_spectrum,this->_width,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar13 = 0;
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
            lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"zcyx",4);
    if (iVar4 == 0) {
      assign(&res,this->_depth,this->_spectrum,this->_height,this->_width);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar13 = 0;
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar4 + iVar11) * 4) = uVar7;
              lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
            }
            lVar13 = lVar13 + lVar10 * 4;
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"cxyz",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_width,this->_height,this->_depth);
      uVar7 = this->_spectrum;
      switch(uVar7) {
      case 1:
        puVar9 = this->_data;
        uVar7 = this->_height;
        uVar5 = this->_width;
        uVar6 = this->_depth;
        for (lVar10 = 0; uVar7 * uVar5 * uVar6 != (int)lVar10; lVar10 = lVar10 + 1) {
          res._data[lVar10] = puVar9[lVar10];
        }
        break;
      case 2:
        uVar7 = this->_height * this->_width * this->_depth;
        puVar9 = this->_data;
        for (lVar10 = 0; uVar7 != (uint)lVar10; lVar10 = lVar10 + 1) {
          res._data[lVar10 * 2] = puVar9[lVar10];
          res._data[lVar10 * 2 + 1] = puVar9[(ulong)uVar7 + lVar10];
        }
        break;
      case 3:
        uVar5 = this->_height * this->_width * this->_depth;
        uVar8 = (ulong)uVar5;
        puVar9 = this->_data;
        uVar7 = uVar5 * 2;
        puVar12 = res._data;
        while (bVar3 = uVar5 != 0, uVar5 = uVar5 - 1, bVar3) {
          *puVar12 = *puVar9;
          puVar12[1] = puVar9[uVar8];
          puVar1 = puVar9 + uVar7;
          puVar9 = puVar9 + 1;
          puVar12[2] = *puVar1;
          puVar12 = puVar12 + 3;
        }
        break;
      case 4:
        puVar9 = this->_data;
        uVar6 = this->_height * this->_width * this->_depth;
        uVar8 = (ulong)uVar6;
        uVar5 = uVar6 * 2;
        uVar7 = uVar6 * 3;
        puVar12 = res._data;
        while (bVar3 = uVar6 != 0, uVar6 = uVar6 - 1, bVar3) {
          *puVar12 = *puVar9;
          puVar12[1] = puVar9[uVar8];
          puVar12[2] = puVar9[uVar5];
          puVar1 = puVar9 + uVar7;
          puVar9 = puVar9 + 1;
          puVar12[3] = *puVar1;
          puVar12 = puVar12 + 4;
        }
        break;
      default:
        lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
        for (iVar4 = 0; iVar4 < (int)uVar7; iVar4 = iVar4 + 1) {
          for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
            for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
              for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
                uVar7 = *puVar18;
                puVar18 = puVar18 + 1;
                res._data[lVar10 * lVar14 +
                          (res._8_8_ & 0xffffffff) * lVar10 * lVar13 +
                          (ulong)(res._width * iVar11 + iVar4)] = uVar7;
              }
            }
          }
          uVar7 = this->_spectrum;
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"cxzy",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_width,this->_depth,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (lVar13 = 0; lVar13 < (int)this->_depth; lVar13 = lVar13 + 1) {
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            for (iVar11 = 0; iVar11 < (int)this->_width; iVar11 = iVar11 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              res._data[lVar10 * lVar13 +
                        (res._8_8_ & 0xffffffff) * lVar10 * lVar14 +
                        (ulong)(res._width * iVar11 + iVar4)] = uVar7;
            }
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"cyxz",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_height,this->_width,this->_depth);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
          }
          lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"cyzx",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_height,this->_depth,this->_width);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        lVar13 = 0;
        for (lVar14 = 0; lVar14 < (int)this->_depth; lVar14 = lVar14 + 1) {
          for (iVar11 = 0; iVar11 < (int)this->_height; iVar11 = iVar11 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
            }
          }
          lVar13 = lVar13 + lVar10 * 4;
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"czxy",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_depth,this->_width,this->_height);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar13 = 0;
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + lVar10 * 4;
            }
            lVar13 = lVar13 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
          }
        }
      }
    }
    iVar4 = cimg::strncasecmp(permut,"czyx",4);
    if (iVar4 == 0) {
      assign(&res,this->_spectrum,this->_depth,this->_height,this->_width);
      lVar10 = ((ulong)res._0_8_ >> 0x20) * (res._0_8_ & 0xffffffff);
      for (iVar4 = 0; iVar4 < (int)this->_spectrum; iVar4 = iVar4 + 1) {
        for (iVar11 = 0; iVar11 < (int)this->_depth; iVar11 = iVar11 + 1) {
          lVar13 = 0;
          for (lVar14 = 0; lVar14 < (int)this->_height; lVar14 = lVar14 + 1) {
            lVar15 = (long)res._data + lVar13;
            for (lVar16 = 0; lVar16 < (int)this->_width; lVar16 = lVar16 + 1) {
              uVar7 = *puVar18;
              puVar18 = puVar18 + 1;
              *(uint *)(lVar15 + (ulong)(res._width * iVar11 + iVar4) * 4) = uVar7;
              lVar15 = lVar15 + (res._8_8_ & 0xffffffff) * lVar10 * 4;
            }
            lVar13 = lVar13 + lVar10 * 4;
          }
        }
      }
    }
    if (res._data == (uint *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar17 = "non-";
      if (this->_is_shared != false) {
        pcVar17 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::permute_axes() : Invalid specified permutation \'%s\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar17,"unsigned int",permut);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    CImg(__return_storage_ptr__,&res);
  }
LAB_00132281:
  ~CImg(&res);
  return __return_storage_ptr__;
}

Assistant:

CImg<t> _get_permute_axes(const char *const permut, const t&) const {
      if (is_empty() || !permut) return CImg<t>(*this,false);
      CImg<t> res;
      const T* ptrs = _data;
      if (!cimg::strncasecmp(permut,"xyzc",4)) return (+*this);
      if (!cimg::strncasecmp(permut,"xycz",4)) {
        res.assign(_width,_height,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,y,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzyc",4)) {
        res.assign(_width,_depth,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xzcy",4)) {
        res.assign(_width,_depth,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,z,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xcyz",4)) {
        res.assign(_width,_spectrum,_height,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,y,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"xczy",4)) {
        res.assign(_width,_spectrum,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(x,c,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxzc",4)) {
        res.assign(_height,_width,_depth,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,z,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yxcz",4)) {
        res.assign(_height,_width,_spectrum,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,x,c,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzxc",4)) {
        res.assign(_height,_depth,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,z,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yzcx",4)) {
        res.assign(_height,_depth,_spectrum,_width);
        switch (_width) {
        case 1 : {
          t *ptr_r = res.data(0,0,0,0);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++);
          }
        } break;
        case 2 : {
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from interleaved RGB to planar RGB
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from interleaved RGBA to planar RGBA
          t *ptr_r = res.data(0,0,0,0), *ptr_g = res.data(0,0,0,1), *ptr_b = res.data(0,0,0,2), *ptr_a = res.data(0,0,0,3);
          for (unsigned int siz = _height*_depth*_spectrum; siz; --siz) {
            *(ptr_r++) = (t)*(ptrs++); *(ptr_g++) = (t)*(ptrs++); *(ptr_b++) = (t)*(ptrs++); *(ptr_a++) = (t)*(ptrs++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(y,z,c,x,wh,whd) = *(ptrs++);
          return res;
        }
        }
      }
      if (!cimg::strncasecmp(permut,"ycxz",4)) {
        res.assign(_height,_spectrum,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"yczx",4)) {
        res.assign(_height,_spectrum,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(y,c,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxyc",4)) {
        res.assign(_depth,_width,_height,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,y,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zxcy",4)) {
        res.assign(_depth,_width,_spectrum,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,x,c,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zyxc",4)) {
        res.assign(_depth,_height,_width,_spectrum);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,x,c,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zycx",4)) {
        res.assign(_depth,_height,_spectrum,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,y,c,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcxy",4)) {
        res.assign(_depth,_spectrum,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"zcyx",4)) {
        res.assign(_depth,_spectrum,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(z,c,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cxyz",4)) {
        res.assign(_spectrum,_width,_height,_depth);
        switch (_spectrum) {
        case 1 : {
          const T *ptr_r = data(0,0,0,0);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++);
          }
        } break;
        case 2 : {
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++);
          }
        } break;
        case 3 : { // Optimization for the classical conversion from planar RGB to interleaved RGB
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++);
          }
        } break;
        case 4 : { // Optimization for the classical conversion from planar RGBA to interleaved RGBA
          const T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
          t *ptrd = res._data;
          for (unsigned int siz = _width*_height*_depth; siz; --siz) {
            *(ptrd++) = (t)*(ptr_r++); *(ptrd++) = (t)*(ptr_g++); *(ptrd++) = (t)*(ptr_b++); *(ptrd++) = (t)*(ptr_a++);
          }
        } break;
        default : {
          const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
          cimg_forXYZC(*this,x,y,z,c) res(c,x,y,z,wh,whd) = (t)*(ptrs++);
        }
        }
      }
      if (!cimg::strncasecmp(permut,"cxzy",4)) {
        res.assign(_spectrum,_width,_depth,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,x,z,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyxz",4)) {
        res.assign(_spectrum,_height,_width,_depth);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,x,z,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"cyzx",4)) {
        res.assign(_spectrum,_height,_depth,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,y,z,x,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czxy",4)) {
        res.assign(_spectrum,_depth,_width,_height);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,x,y,wh,whd) = (t)*(ptrs++);
      }
      if (!cimg::strncasecmp(permut,"czyx",4)) {
        res.assign(_spectrum,_depth,_height,_width);
        const unsigned long wh = (unsigned long)res._width*res._height, whd = wh*res._depth;
        cimg_forXYZC(*this,x,y,z,c) res(c,z,y,x,wh,whd) = (t)*(ptrs++);
      }
      if (!res)
        throw CImgArgumentException(_cimg_instance
                                    "permute_axes() : Invalid specified permutation '%s'.",
                                    cimg_instance,
                                    permut);
      return res;
    }